

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

uint __thiscall Assimp::SMDImporter::GetTextureIndex(SMDImporter *this,string *filename)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  pointer pbVar4;
  
  pbVar4 = (this->aszTextures).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = -(long)pbVar4;
  uVar2 = 0;
  while( true ) {
    if (pbVar4 == (this->aszTextures).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar4 = (this->aszTextures).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->aszTextures,filename);
      return (uint)((ulong)-((long)&(pbVar4->_M_dataplus)._M_p + lVar3) >> 5);
    }
    iVar1 = ASSIMP_stricmp((filename->_M_dataplus)._M_p,(pbVar4->_M_dataplus)._M_p);
    if (iVar1 == 0) break;
    pbVar4 = pbVar4 + 1;
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + -0x20;
  }
  return uVar2;
}

Assistant:

unsigned int SMDImporter::GetTextureIndex(const std::string& filename) {
    unsigned int iIndex = 0;
    for (std::vector<std::string>::const_iterator
            i =  aszTextures.begin();
            i != aszTextures.end();++i,++iIndex) {
        // case-insensitive ... it's a path
        if (0 == ASSIMP_stricmp ( filename.c_str(),(*i).c_str())) {
            return iIndex;
        }
    }
    iIndex = (unsigned int)aszTextures.size();
    aszTextures.push_back(filename);
    return iIndex;
}